

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorintegration.cpp
# Opt level: O2

EGLNativeWindowType __thiscall
QEglFSEmulatorIntegration::createNativeWindow
          (QEglFSEmulatorIntegration *this,QPlatformWindow *platformWindow,QSize *size,
          QSurfaceFormat *format)

{
  PFNQGSSETDISPLAYPROC p_Var1;
  QBasicAtomicInt QVar2;
  uint uVar3;
  QEglFSEmulatorScreen *this_00;
  
  this_00 = (QEglFSEmulatorScreen *)(**(code **)(*(long *)platformWindow + 0x18))(platformWindow);
  if ((this_00 != (QEglFSEmulatorScreen *)0x0) &&
     (p_Var1 = this->setDisplay, p_Var1 != (PFNQGSSETDISPLAYPROC)0x0)) {
    uVar3 = QEglFSEmulatorScreen::id(this_00);
    (*p_Var1)(uVar3);
  }
  QVar2._q_value.super___atomic_base<int>._M_i =
       createNativeWindow::uniqueWindowId._q_value.super___atomic_base<int>._M_i;
  LOCK();
  createNativeWindow::uniqueWindowId._q_value.super___atomic_base<int>._M_i =
       (Type)(Type)((int)createNativeWindow::uniqueWindowId._q_value.super___atomic_base<int>._M_i +
                   1);
  UNLOCK();
  return (long)((int)QVar2._q_value.super___atomic_base<int>._M_i + 1);
}

Assistant:

EGLNativeWindowType QEglFSEmulatorIntegration::createNativeWindow(QPlatformWindow *platformWindow,
                                                                  const QSize &size,
                                                                  const QSurfaceFormat &format)
{
    Q_UNUSED(size);
    Q_UNUSED(format);
    QEglFSEmulatorScreen *screen = static_cast<QEglFSEmulatorScreen *>(platformWindow->screen());
    if (screen && setDisplay) {
        // Let the emulator know which screen the window surface is attached to
        setDisplay(screen->id());
    }
    Q_CONSTINIT static QBasicAtomicInt uniqueWindowId = Q_BASIC_ATOMIC_INITIALIZER(0);
    return EGLNativeWindowType(qintptr(1 + uniqueWindowId.fetchAndAddRelaxed(1)));
}